

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O3

void __thiscall V2Boost::render(V2Boost *this,StereoSample *buf,int nsamples)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  if (this->enabled == true) {
    lVar3 = 0;
    bVar1 = true;
    do {
      bVar2 = bVar1;
      fVar9 = this->x1[lVar3];
      fVar10 = this->x2[lVar3];
      fVar8 = this->y1[lVar3];
      fVar6 = this->y2[lVar3];
      if (0 < nsamples) {
        uVar4 = 0;
        fVar5 = fVar6;
        fVar7 = fVar10;
        do {
          fVar6 = fVar8;
          fVar10 = fVar9;
          fVar9 = *(float *)((long)buf + uVar4 * 8 + lVar3 * 4) + 3.8146973e-06;
          fVar8 = ((fVar7 * this->b2 + this->b0 * fVar9 + this->b1 * fVar10) - this->a1 * fVar6) -
                  fVar5 * this->a2;
          *(float *)((long)buf + uVar4 * 8 + lVar3 * 4) = fVar8;
          uVar4 = uVar4 + 1;
          fVar5 = fVar6;
          fVar7 = fVar10;
        } while ((uint)nsamples != uVar4);
      }
      this->x1[lVar3] = fVar9;
      this->x2[lVar3] = fVar10;
      this->y1[lVar3] = fVar8;
      this->y2[lVar3] = fVar6;
      lVar3 = 1;
      bVar1 = false;
    } while (bVar2);
  }
  return;
}

Assistant:

void render(StereoSample *buf, int nsamples)
    {
        if (!enabled)
            return;

        COVER("BOOST render");

        for (int ch=0; ch < 2; ch++)
        {
            float xm1 = x1[ch], xm2 = x2[ch];
            float ym1 = y1[ch], ym2 = y2[ch];

            for (int i=0; i < nsamples; i++)
            {
                float x = buf[i].ch[ch] + fcdcoffset;

                // Second-order IIR filter
                float y = b0*x + b1*xm1 + b2*xm2 - a1*ym1 - a2*ym2;
                ym2 = ym1; ym1 = y;
                xm2 = xm1; xm1 = x;

                buf[i].ch[ch] = y;
            }

            x1[ch] = xm1; x2[ch] = xm2;
            y1[ch] = ym1; y2[ch] = ym2;
        }
    }